

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

char * deqp::gls::FragmentOpUtil::getVertSrc(GLSLVersion glslVersion)

{
  char *pcStack_10;
  GLSLVersion glslVersion_local;
  
  if (glslVersion == GLSL_VERSION_100_ES) {
    pcStack_10 = s_glsl1VertSrc;
  }
  else if (glslVersion == GLSL_VERSION_300_ES) {
    pcStack_10 = s_glsl3VertSrc;
  }
  else if (glslVersion == GLSL_VERSION_330) {
    pcStack_10 = s_glsl33VertSrc;
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getVertSrc (glu::GLSLVersion glslVersion)
{
	if (glslVersion == glu::GLSL_VERSION_100_ES)
		return s_glsl1VertSrc;
	else if (glslVersion == glu::GLSL_VERSION_300_ES)
		return s_glsl3VertSrc;
	else if (glslVersion == glu::GLSL_VERSION_330)
		return s_glsl33VertSrc;

	DE_ASSERT(DE_FALSE);
	return 0;
}